

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgeadd_is(int m,int n,double *a,int lda,double *b,int ldb)

{
  ulong uVar1;
  ulong uVar2;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3b,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3c,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x3d,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
  }
  if ((0 < ldb) && (n <= ldb)) {
    if (0 < m) {
      uVar1 = 0;
      do {
        if (0 < n) {
          uVar2 = 0;
          do {
            b[uVar2] = a[uVar2] + b[uVar2];
            uVar2 = uVar2 + 1;
          } while ((uint)n != uVar2);
        }
        uVar1 = uVar1 + 1;
        b = b + (uint)ldb;
        a = a + (uint)lda;
      } while (uVar1 != (uint)m);
    }
    return;
  }
  __assert_fail("ldb >= 1 && ldb >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x3e,"void la_dgeadd_is(int, int, const double *, int, double *, int)");
}

Assistant:

void la_dgeadd_is(
        int m, int n,
        const double *a, int lda,
        double *b, int ldb)
{
    assert(a);
    assert(b);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            b[i * ldb + j] += a[i * lda + j];
        }
    }
}